

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::DoThrow(Thread *this,Ptr *exn)

{
  pointer *ppFVar1;
  uint uVar2;
  u32 uVar3;
  u32 uVar4;
  pointer pCVar5;
  size_t sVar6;
  size_t sVar7;
  Module *pMVar8;
  bool bVar9;
  bool bVar10;
  pointer pHVar11;
  pointer pHVar12;
  u32 uVar13;
  pointer pCVar14;
  pointer pFVar15;
  bool bVar16;
  RunResult local_d0;
  u32 local_cc;
  vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> handlers;
  Ptr func;
  Ptr exn_tag;
  Ptr catch_tag;
  
  RefPtr<wabt::interp::Tag>::RefPtr(&exn_tag,this->store_,(Ref)(exn->obj_->tag_).index);
  local_cc = 0xffffffff;
  bVar9 = false;
  local_d0 = Exception;
  uVar4 = 3;
  uVar3 = 3;
  while (pFVar15 = (this->frames_).
                   super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
        (this->frames_).
        super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
        super__Vector_impl_data._M_start != pFVar15) {
    RefPtr<wabt::interp::DefinedFunc>::RefPtr(&func,this->store_,(Ref)pFVar15[-1].func.index);
    uVar2 = pFVar15[-1].offset;
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
              (&handlers,&((func.obj_)->desc_).handlers);
    pHVar12 = handlers.
              super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    while (pHVar11 = pHVar12,
          pHVar11 !=
          handlers.
          super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
          _M_impl.super__Vector_impl_data._M_start) {
      pHVar12 = pHVar11 + -1;
      if ((pHVar11[-1].try_start_offset <= uVar2) && (uVar2 < pHVar11[-1].try_end_offset)) {
        if (pHVar12->kind == Delegate) {
          pHVar12 = handlers.
                    super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    (ulong)pHVar11[-1].field_4.catch_all_offset + 1;
        }
        else {
          pCVar14 = pHVar11[-1].catches.
                    super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pCVar5 = pHVar11[-1].catches.
                   super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          while (pCVar14 != pCVar5) {
            uVar13 = pCVar14->offset;
            RefPtr<wabt::interp::Tag>::RefPtr
                      (&catch_tag,this->store_,
                       (Ref)((pFVar15[-1].inst)->tags_).
                            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                            ._M_impl.super__Vector_impl_data._M_start[pCVar14->tag_index].index);
            sVar6 = ((exn_tag.obj_)->super_Extern).super_Object.self_.index;
            sVar7 = ((catch_tag.obj_)->super_Extern).super_Object.self_.index;
            bVar16 = sVar6 == sVar7;
            if (bVar16) {
              uVar3 = pHVar11[-1].values;
              uVar4 = pHVar11[-1].exceptions;
              local_cc = uVar13;
            }
            RefPtr<wabt::interp::Tag>::reset(&catch_tag);
            pCVar14 = pCVar14 + 1;
            if (sVar6 == sVar7) goto LAB_001259ee;
          }
          uVar13 = pHVar11[-1].field_4.catch_all_offset;
          if (uVar13 != 0xffffffff) {
            uVar3 = pHVar11[-1].values;
            uVar4 = pHVar11[-1].exceptions;
            std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::
            ~vector(&handlers);
            RefPtr<wabt::interp::DefinedFunc>::reset(&func);
            pFVar15 = (this->frames_).
                      super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            bVar16 = true;
            bVar10 = true;
            if (!bVar9) goto LAB_00125a41;
            goto LAB_00125a37;
          }
        }
      }
    }
    ppFVar1 = &(this->frames_).
               super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl
               .super__Vector_impl_data._M_finish;
    *ppFVar1 = *ppFVar1 + -1;
    bVar9 = true;
    bVar16 = false;
LAB_001259ee:
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
              (&handlers);
    RefPtr<wabt::interp::DefinedFunc>::reset(&func);
    if (bVar16) goto code_r0x00125a10;
  }
LAB_00125aad:
  RefPtr<wabt::interp::Tag>::reset(&exn_tag);
  return local_d0;
code_r0x00125a10:
  if (bVar16) {
    if (local_cc == 0xffffffff) {
      __assert_fail("target_offset != Istream::kInvalidOffset",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp.cc"
                    ,0xa53,"RunResult wabt::interp::Thread::DoThrow(Exception::Ptr)");
    }
    pFVar15 = (this->frames_).
              super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
              super__Vector_impl_data._M_finish;
    bVar16 = false;
    uVar13 = local_cc;
    bVar10 = false;
    if (bVar9) {
LAB_00125a37:
      bVar16 = bVar10;
      pMVar8 = pFVar15[-1].mod;
      this->inst_ = pFVar15[-1].inst;
      this->mod_ = pMVar8;
    }
LAB_00125a41:
    std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::resize
              (&this->values_,(ulong)(uVar3 + pFVar15[-1].values));
    std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::resize
              (&this->exceptions_,(ulong)(uVar4 + pFVar15[-1].exceptions));
    pFVar15[-1].offset = uVar13;
    func.obj_ = (DefinedFunc *)RefPtr<wabt::interp::Exception>::ref(exn);
    std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
    emplace_back<wabt::interp::Ref>(&this->exceptions_,(Ref *)&func);
    local_d0 = Ok;
    if (!bVar16) {
      PushValues(this,&((exn_tag.obj_)->type_).signature,&exn->obj_->args_);
    }
  }
  goto LAB_00125aad;
}

Assistant:

RunResult Thread::DoThrow(Exception::Ptr exn) {
  Istream::Offset target_offset = Istream::kInvalidOffset;
  u32 target_values, target_exceptions;
  Tag::Ptr exn_tag{store_, exn->tag()};
  bool popped_frame = false;
  bool had_catch_all = false;

  // DoThrow is responsible for unwinding the stack at the point at which an
  // exception is thrown, and also branching to the appropriate catch within
  // the target try-catch. In a compiler, the tag dispatch might be done in
  // generated code in a landing pad, but this is easier for the interpreter.
  while (!frames_.empty()) {
    const Frame& frame = frames_.back();
    DefinedFunc::Ptr func{store_, frame.func};
    u32 pc = frame.offset;
    auto handlers = func->desc().handlers;

    // We iterate in reverse order, in order to traverse handlers from most
    // specific (pushed last) to least specific within a nested stack of
    // try-catch blocks.
    auto iter = handlers.rbegin();
    while (iter != handlers.rend()) {
      const HandlerDesc& handler = *iter;
      if (pc >= handler.try_start_offset && pc < handler.try_end_offset) {
        // For a try-delegate, skip part of the traversal by directly going
        // up to an outer handler specified by the delegate depth.
        if (handler.kind == HandlerKind::Delegate) {
          // Subtract one as we're trying to get a reverse iterator that is
          // offset by `delegate_handler_index` from the first item.
          iter = handlers.rend() - handler.delegate_handler_index - 1;
          continue;
        }
        // Otherwise, check for a matching catch tag or catch_all.
        for (auto _catch : handler.catches) {
          // Here we have to be careful to use the target frame's instance
          // to look up the tag rather than the throw's instance.
          Ref catch_tag_ref = frame.inst->tags()[_catch.tag_index];
          Tag::Ptr catch_tag{store_, catch_tag_ref};
          if (exn_tag == catch_tag) {
            target_offset = _catch.offset;
            target_values = (*iter).values;
            target_exceptions = (*iter).exceptions;
            goto found_handler;
          }
        }
        if (handler.catch_all_offset != Istream::kInvalidOffset) {
          target_offset = handler.catch_all_offset;
          target_values = (*iter).values;
          target_exceptions = (*iter).exceptions;
          had_catch_all = true;
          goto found_handler;
        }
      }
      iter++;
    }
    frames_.pop_back();
    popped_frame = true;
  }

  // If the call frames are empty now, the exception is uncaught.
  assert(frames_.empty());
  return RunResult::Exception;

found_handler:
  assert(target_offset != Istream::kInvalidOffset);

  Frame& target_frame = frames_.back();
  // If the throw crosses call frames, we need to reset the state to that
  // call frame's values. The stack heights may need to be offset by the
  // handler's heights as we may be jumping into the middle of the function
  // code after some stack height changes.
  if (popped_frame) {
    inst_ = target_frame.inst;
    mod_ = target_frame.mod;
  }
  values_.resize(target_frame.values + target_values);
  exceptions_.resize(target_frame.exceptions + target_exceptions);
  // Jump to the handler.
  target_frame.offset = target_offset;
  // When an exception is caught, it needs to be tracked in a stack
  // to allow for rethrows. This stack is popped on leaving the try-catch
  // or by control instructions such as `br`.
  exceptions_.push_back(exn.ref());
  // Also push exception payload values if applicable.
  if (!had_catch_all) {
    PushValues(exn_tag->type().signature, exn->args());
  }
  return RunResult::Ok;
}